

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalGenerator *lg,char *targetDir,string *lang,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  cmMakefile *this_00;
  char *pcVar3;
  string complainRegex;
  string scanRegex;
  string scanRegexVar;
  string complainRegexVar;
  long *local_b8;
  char *local_b0;
  long local_a8 [2];
  long *local_98;
  char *local_90;
  long local_88 [2];
  string local_78;
  string local_58;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_38;
  
  cmDepends::cmDepends(&this->super_cmDepends,lg,targetDir);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_006191a8;
  (this->IncludeRegexLine).program = (char *)0x0;
  (this->IncludeRegexScan).program = (char *)0x0;
  (this->IncludeRegexComplain).program = (char *)0x0;
  (this->IncludeRegexLineString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexLineString).field_2
  ;
  (this->IncludeRegexLineString)._M_string_length = 0;
  (this->IncludeRegexLineString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexScanString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexScanString).field_2
  ;
  (this->IncludeRegexScanString)._M_string_length = 0;
  (this->IncludeRegexScanString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexComplainString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexComplainString).field_2;
  (this->IncludeRegexComplainString)._M_string_length = 0;
  (this->IncludeRegexComplainString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransformString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexTransformString).field_2;
  (this->IncludeRegexTransformString)._M_string_length = 0;
  (this->IncludeRegexTransformString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransform).program = (char *)0x0;
  p_Var1 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ValidDeps = validDeps;
  p_Var1 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
  _M_initialize_map((_Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                     *)&this->Unscanned,0);
  p_Var1 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = &this->CacheFileName;
  (this->CacheFileName)._M_dataplus._M_p = (pointer)&(this->CacheFileName).field_2;
  (this->CacheFileName)._M_string_length = 0;
  (this->CacheFileName).field_2._M_local_buf[0] = '\0';
  this_00 = lg->Makefile;
  local_38 = &this->Unscanned;
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,lang);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"^.*$","");
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"^$","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_78,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_78);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_78);
  if (pcVar3 != (char *)0x0) {
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,(ulong)pcVar3);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_58);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_58);
  if (pcVar3 != (char *)0x0) {
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,(ulong)pcVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  cmsys::RegularExpression::compile
            (&this->IncludeRegexLine,"^[ \t]*#[ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  cmsys::RegularExpression::compile(&this->IncludeRegexScan,(char *)local_98);
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,(char *)local_b8);
  std::__cxx11::string::_M_replace
            ((ulong)&this->IncludeRegexLineString,0,
             (char *)(this->IncludeRegexLineString)._M_string_length,0x52d542);
  std::__cxx11::string::_M_replace
            ((ulong)&this->IncludeRegexScanString,0,
             (char *)(this->IncludeRegexScanString)._M_string_length,0x52d589);
  std::__cxx11::string::_M_append((char *)&this->IncludeRegexScanString,(ulong)local_98);
  std::__cxx11::string::_M_replace
            ((ulong)&this->IncludeRegexComplainString,0,
             (char *)(this->IncludeRegexComplainString)._M_string_length,0x52d59d);
  std::__cxx11::string::_M_append((char *)&this->IncludeRegexComplainString,(ulong)local_b8);
  SetupTransforms(this);
  std::__cxx11::string::_M_assign((string *)psVar2);
  std::__cxx11::string::append((char *)psVar2);
  std::__cxx11::string::_M_append((char *)psVar2,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)psVar2);
  ReadCacheFile(this);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalGenerator* lg,
                   const char* targetDir,
                   const std::string& lang,
                   const std::map<std::string, DependencyVector>* validDeps)
: cmDepends(lg, targetDir)
, ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
  std::string scanRegexVar = "CMAKE_";
  scanRegexVar += lang;
  scanRegexVar += "_INCLUDE_REGEX_SCAN";
  if(const char* sr = mf->GetDefinition(scanRegexVar))
    {
    scanRegex = sr;
    }
  std::string complainRegexVar = "CMAKE_";
  complainRegexVar += lang;
  complainRegexVar += "_INCLUDE_REGEX_COMPLAIN";
  if(const char* cr = mf->GetDefinition(complainRegexVar))
    {
    complainRegex = cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex.c_str());
  this->IncludeRegexComplain.compile(complainRegex.c_str());
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString = INCLUDE_REGEX_SCAN_MARKER;
  this->IncludeRegexScanString += scanRegex;
  this->IncludeRegexComplainString = INCLUDE_REGEX_COMPLAIN_MARKER;
  this->IncludeRegexComplainString += complainRegex;

  this->SetupTransforms();

  this->CacheFileName = this->TargetDirectory;
  this->CacheFileName += "/";
  this->CacheFileName += lang;
  this->CacheFileName += ".includecache";

  this->ReadCacheFile();
}